

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>::
Initialize(HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,HeapInfo *heapInfo,uint sizeCat)

{
  bool bVar1;
  
  (this->super_HeapBucket).heapInfo = heapInfo;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<MediumAllocationBlockAttributes>
                    (heapInfo,(ulong)sizeCat);
  (this->super_HeapBucket).isPageHeapEnabled = bVar1;
  (this->super_HeapBucket).sizeCat = sizeCat;
  SmallHeapBlockAllocator<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Initialize(&this->allocatorHead);
  (this->allocatorHead).bucket = &this->super_HeapBucket;
  this->lastExplicitFreeListAllocator = &this->allocatorHead;
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::Initialize(HeapInfo * heapInfo, uint sizeCat)
{
    this->heapInfo = heapInfo;
#ifdef RECYCLER_PAGE_HEAP
    this->isPageHeapEnabled = heapInfo->IsPageHeapEnabledForBlock<typename TBlockType::HeapBlockAttributes>(sizeCat);
#endif
    this->sizeCat = sizeCat;
    allocatorHead.Initialize();
#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY)
    allocatorHead.bucket = this;
#endif
    this->lastExplicitFreeListAllocator = &allocatorHead;
}